

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O0

void proto2_unittest::TestRedactedMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestRedactedMessage *pTVar2;
  string *psVar3;
  TestRedactedMessage **v1;
  TestRedactedMessage **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  uint32_t *puVar5;
  Arena *pAVar6;
  Any *pAVar7;
  LogMessage local_168;
  Voidify local_151;
  uint local_150;
  uint32_t cached_has_bits;
  LogMessage local_140;
  Voidify local_129;
  TestRedactedMessage *local_128;
  Nullable<const_char_*> local_120;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestRedactedMessage *from;
  TestRedactedMessage *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_e8;
  string *local_e0;
  TestRedactedMessage *local_d8;
  anon_union_88_1_493b367e_for_TestRedactedMessage_3 *local_d0;
  string *local_c8;
  TestRedactedMessage *local_c0;
  anon_union_88_1_493b367e_for_TestRedactedMessage_3 *local_b8;
  string *local_b0;
  TestRedactedMessage *local_a8;
  anon_union_88_1_493b367e_for_TestRedactedMessage_3 *local_a0;
  string *local_98;
  TestRedactedMessage *local_90;
  anon_union_88_1_493b367e_for_TestRedactedMessage_3 *local_88;
  string *local_80;
  TestRedactedMessage *local_78;
  anon_union_88_1_493b367e_for_TestRedactedMessage_3 *local_70;
  string *local_68;
  TestRedactedMessage *local_60;
  anon_union_88_1_493b367e_for_TestRedactedMessage_3 *local_58;
  string *local_50;
  TestRedactedMessage *local_48;
  anon_union_88_1_493b367e_for_TestRedactedMessage_3 *local_40;
  string *local_38;
  TestRedactedMessage *local_30;
  anon_union_88_1_493b367e_for_TestRedactedMessage_3 *local_28;
  string *local_20;
  TestRedactedMessage *local_18;
  anon_union_88_1_493b367e_for_TestRedactedMessage_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (TestRedactedMessage *)to_msg;
  _this = (TestRedactedMessage *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_128 = (TestRedactedMessage *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestRedactedMessage_const*>(&local_128);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestRedactedMessage*>(&from);
  local_120 = absl::lts_20250127::log_internal::
              Check_NEImpl<proto2_unittest::TestRedactedMessage_const*,proto2_unittest::TestRedactedMessage*>
                        (v1,v2,"&from != _this");
  if (local_120 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_120);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_redaction.pb.cc"
               ,0x765,failure_msg);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_140);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_129,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_140);
  }
  local_150 = 0;
  puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  pTVar2 = from;
  local_150 = *puVar5;
  if ((local_150 & 0xff) != 0) {
    if ((local_150 & 1) != 0) {
      local_e0 = _internal_text_field_abi_cxx11_((TestRedactedMessage *)arena);
      local_d8 = pTVar2;
      local_d0 = &pTVar2->field_0;
      puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_e0;
      *puVar5 = *puVar5 | 1;
      pAVar6 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.text_field_,psVar3,pAVar6);
    }
    pTVar2 = from;
    if ((local_150 & 2) != 0) {
      local_c8 = _internal_meta_annotated_abi_cxx11_((TestRedactedMessage *)arena);
      local_c0 = pTVar2;
      local_b8 = &pTVar2->field_0;
      puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_c8;
      *puVar5 = *puVar5 | 2;
      pAVar6 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.meta_annotated_,psVar3,pAVar6);
    }
    pTVar2 = from;
    if ((local_150 & 4) != 0) {
      local_b0 = _internal_repeated_meta_annotated_abi_cxx11_((TestRedactedMessage *)arena);
      local_a8 = pTVar2;
      local_a0 = &pTVar2->field_0;
      puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_b0;
      *puVar5 = *puVar5 | 4;
      pAVar6 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.repeated_meta_annotated_,psVar3,pAVar6);
    }
    pTVar2 = from;
    if ((local_150 & 8) != 0) {
      local_98 = _internal_unredacted_repeated_annotations_abi_cxx11_((TestRedactedMessage *)arena);
      local_90 = pTVar2;
      local_88 = &pTVar2->field_0;
      puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_98;
      *puVar5 = *puVar5 | 8;
      pAVar6 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.unredacted_repeated_annotations_,psVar3,pAVar6);
    }
    pTVar2 = from;
    if ((local_150 & 0x10) != 0) {
      local_80 = _internal_unreported_non_meta_debug_redact_field_abi_cxx11_
                           ((TestRedactedMessage *)arena);
      local_78 = pTVar2;
      local_70 = &pTVar2->field_0;
      puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_80;
      *puVar5 = *puVar5 | 0x10;
      pAVar6 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.unreported_non_meta_debug_redact_field_,psVar3,pAVar6);
    }
    pTVar2 = from;
    if ((local_150 & 0x20) != 0) {
      local_68 = _internal_redactable_false_abi_cxx11_((TestRedactedMessage *)arena);
      local_60 = pTVar2;
      local_58 = &pTVar2->field_0;
      puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_68;
      *puVar5 = *puVar5 | 0x20;
      pAVar6 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.redactable_false_,psVar3,pAVar6);
    }
    pTVar2 = from;
    if ((local_150 & 0x40) != 0) {
      local_50 = _internal_test_direct_message_enum_abi_cxx11_((TestRedactedMessage *)arena);
      local_48 = pTVar2;
      local_40 = &pTVar2->field_0;
      puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_50;
      *puVar5 = *puVar5 | 0x40;
      pAVar6 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.test_direct_message_enum_,psVar3,pAVar6);
    }
    pTVar2 = from;
    if ((local_150 & 0x80) != 0) {
      local_38 = _internal_test_nested_message_enum_abi_cxx11_((TestRedactedMessage *)arena);
      local_30 = pTVar2;
      local_28 = &pTVar2->field_0;
      puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_38;
      *puVar5 = *puVar5 | 0x80;
      pAVar6 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.test_nested_message_enum_,psVar3,pAVar6);
    }
  }
  pTVar2 = from;
  if ((local_150 & 0x300) != 0) {
    if ((local_150 & 0x100) != 0) {
      local_20 = _internal_test_redacted_message_enum_abi_cxx11_((TestRedactedMessage *)arena);
      local_18 = pTVar2;
      local_10 = &pTVar2->field_0;
      puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_20;
      *puVar5 = *puVar5 | 0x100;
      pAVar6 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.test_redacted_message_enum_,psVar3,pAVar6);
    }
    if ((local_150 & 0x200) != 0) {
      if ((arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_168,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_redaction.pb.cc"
                   ,0x789,"from._impl_.any_field_ != nullptr");
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_168);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_151,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_168);
      }
      if ((from->field_0)._impl_.any_field_ == (Any *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_;
        local_e8 = absl_log_internal_check_op_result;
        pAVar7 = (Any *)google::protobuf::Arena::CopyConstruct<google::protobuf::Any>
                                  ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.any_field_ = pAVar7;
      }
      else {
        google::protobuf::Any::MergeFrom
                  ((from->field_0)._impl_.any_field_,
                   (Any *)(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_);
      }
    }
  }
  uVar1 = local_150;
  puVar5 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar5 = uVar1 | *puVar5;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestRedactedMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestRedactedMessage*>(&to_msg);
  auto& from = static_cast<const TestRedactedMessage&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestRedactedMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_text_field(from._internal_text_field());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_meta_annotated(from._internal_meta_annotated());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_repeated_meta_annotated(from._internal_repeated_meta_annotated());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_unredacted_repeated_annotations(from._internal_unredacted_repeated_annotations());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_internal_set_unreported_non_meta_debug_redact_field(from._internal_unreported_non_meta_debug_redact_field());
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_internal_set_redactable_false(from._internal_redactable_false());
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_internal_set_test_direct_message_enum(from._internal_test_direct_message_enum());
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_internal_set_test_nested_message_enum(from._internal_test_nested_message_enum());
    }
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_internal_set_test_redacted_message_enum(from._internal_test_redacted_message_enum());
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(from._impl_.any_field_ != nullptr);
      if (_this->_impl_.any_field_ == nullptr) {
        _this->_impl_.any_field_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.any_field_);
      } else {
        _this->_impl_.any_field_->MergeFrom(*from._impl_.any_field_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}